

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createDeviceFeatures2Test
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkInstance instance_00;
  RefData<vk::VkInstance_s_*> data;
  RefData<vk::VkDevice_s_*> data_00;
  VkAllocationCallbacks *platformInterface;
  VkResult result;
  VkInstance_s **ppVVar1;
  TestContext *this;
  CommandLine *cmdLine;
  VkPhysicalDevice physicalDevice_00;
  VkDevice_s **ppVVar2;
  allocator<char> local_8a1;
  string local_8a0;
  VkQueue local_880;
  VkQueue queue;
  DeviceDriver vkd;
  RefData<vk::VkDevice_s_*> local_3a8;
  undefined1 local_390 [8];
  Unique<vk::VkDevice_s_*> device;
  VkDeviceCreateInfo deviceCreateInfo;
  VkDeviceQueueCreateInfo deviceQueueCreateInfo;
  VkPhysicalDeviceFeatures2KHR enabledFeatures;
  float queuePriority;
  deUint32 queueIndex;
  deUint32 queueCount;
  deUint32 queueFamilyIndex;
  VkPhysicalDevice physicalDevice;
  InstanceDriver vki;
  Move<vk::VkInstance_s_*> local_68;
  RefData<vk::VkInstance_s_*> local_50;
  undefined1 local_38 [8];
  Unique<vk::VkInstance_s_*> instance;
  PlatformInterface *vkp;
  Context *context_local;
  
  instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Context::getPlatformInterface(context);
  createInstanceWithExtension
            (&local_68,
             (PlatformInterface *)
             instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             "VK_KHR_get_physical_device_properties2");
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_50,(Move *)&local_68);
  data.deleter.m_destroyInstance = local_50.deleter.m_destroyInstance;
  data.object = local_50.object;
  data.deleter.m_allocator = local_50.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::Unique((Unique<vk::VkInstance_s_*> *)local_38,data);
  ::vk::refdetails::Move<vk::VkInstance_s_*>::~Move(&local_68);
  platformInterface = instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator;
  ppVVar1 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::get
                      ((RefBase<vk::VkInstance_s_*> *)local_38);
  ::vk::InstanceDriver::InstanceDriver
            ((InstanceDriver *)&physicalDevice,(PlatformInterface *)platformInterface,*ppVVar1);
  ppVVar1 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::get
                      ((RefBase<vk::VkInstance_s_*> *)local_38);
  instance_00 = *ppVVar1;
  this = Context::getTestContext(context);
  cmdLine = tcu::TestContext::getCommandLine(this);
  physicalDevice_00 = ::vk::chooseDevice((InstanceInterface *)&physicalDevice,instance_00,cmdLine);
  enabledFeatures._236_4_ = 0;
  enabledFeatures.features.inheritedQueries = 0x3f800000;
  deviceCreateInfo.pEnabledFeatures._0_4_ = 2;
  deviceQueueCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  deviceQueueCreateInfo._4_4_ = 0;
  deviceQueueCreateInfo.pNext._0_4_ = 0;
  deviceQueueCreateInfo.pNext._4_4_ = 0;
  deviceQueueCreateInfo.flags = 1;
  deviceQueueCreateInfo._24_8_ = &enabledFeatures.features.inheritedQueries;
  device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator._0_4_ = 3;
  deviceCreateInfo._0_8_ = &deviceQueueCreateInfo.pQueuePriorities;
  deviceCreateInfo.pNext._0_4_ = 0;
  deviceCreateInfo.pNext._4_4_ = 1;
  deviceCreateInfo._16_8_ = &deviceCreateInfo.pEnabledFeatures;
  deviceCreateInfo.pQueueCreateInfos._0_4_ = 0;
  deviceCreateInfo.enabledLayerCount = 0;
  deviceCreateInfo._36_4_ = 0;
  deviceCreateInfo.ppEnabledLayerNames._0_4_ = 0;
  deviceCreateInfo.enabledExtensionCount = 0;
  deviceCreateInfo._52_4_ = 0;
  deviceCreateInfo.ppEnabledExtensionNames = (char **)0x0;
  deviceQueueCreateInfo.pQueuePriorities._0_4_ = 0x3b9bb078;
  enabledFeatures.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  enabledFeatures._4_4_ = 0;
  ::vk::InstanceDriver::getPhysicalDeviceFeatures2KHR
            ((InstanceDriver *)&physicalDevice,physicalDevice_00,
             (VkPhysicalDeviceFeatures2KHR *)deviceCreateInfo._0_8_);
  ::vk::createDevice((Move<vk::VkDevice_s_*> *)&vkd.m_vk.getPastPresentationTimingGOOGLE,
                     (InstanceInterface *)&physicalDevice,physicalDevice_00,
                     (VkDeviceCreateInfo *)
                     &device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,
                     (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_3a8,(Move *)&vkd.m_vk.getPastPresentationTimingGOOGLE);
  data_00.deleter.m_destroyDevice = local_3a8.deleter.m_destroyDevice;
  data_00.object = local_3a8.object;
  data_00.deleter.m_allocator = local_3a8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::Unique((Unique<vk::VkDevice_s_*> *)local_390,data_00);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move
            ((Move<vk::VkDevice_s_*> *)&vkd.m_vk.getPastPresentationTimingGOOGLE);
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::get((RefBase<vk::VkDevice_s_*> *)local_390)
  ;
  ::vk::DeviceDriver::DeviceDriver
            ((DeviceDriver *)&queue,(InstanceInterface *)&physicalDevice,*ppVVar2);
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      ((RefBase<vk::VkDevice_s_*> *)local_390);
  local_880 = ::vk::getDeviceQueue((DeviceInterface *)&queue,*ppVVar2,0,0);
  result = ::vk::DeviceDriver::queueWaitIdle((DeviceDriver *)&queue,local_880);
  ::vk::checkResult(result,"vkd.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                    ,0x2b1);
  ::vk::DeviceDriver::~DeviceDriver((DeviceDriver *)&queue);
  ::vk::refdetails::Unique<vk::VkDevice_s_*>::~Unique((Unique<vk::VkDevice_s_*> *)local_390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"Pass",&local_8a1);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_8a0);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  ::vk::InstanceDriver::~InstanceDriver((InstanceDriver *)&physicalDevice);
  ::vk::refdetails::Unique<vk::VkInstance_s_*>::~Unique((Unique<vk::VkInstance_s_*> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createDeviceFeatures2Test (Context& context)
{
	const PlatformInterface&		vkp						= context.getPlatformInterface();
	const Unique<VkInstance>		instance				(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki						(vkp, instance.get());
	const VkPhysicalDevice			physicalDevice			= chooseDevice(vki, instance.get(), context.getTestContext().getCommandLine());
	const deUint32					queueFamilyIndex		= 0;
	const deUint32					queueCount				= 1;
	const deUint32					queueIndex				= 0;
	const float						queuePriority			= 1.0f;

	VkPhysicalDeviceFeatures2KHR	enabledFeatures;
	const VkDeviceQueueCreateInfo	deviceQueueCreateInfo	=
	{
		VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,
		DE_NULL,
		(VkDeviceQueueCreateFlags)0u,
		queueFamilyIndex,
		queueCount,
		&queuePriority,
	};
	const VkDeviceCreateInfo		deviceCreateInfo	=
	{
		VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,
		&enabledFeatures,
		(VkDeviceCreateFlags)0u,
		1,
		&deviceQueueCreateInfo,
		0,
		DE_NULL,
		0,
		DE_NULL,
		DE_NULL,
	};

	// Populate enabledFeatures
	enabledFeatures.sType		= VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2_KHR;
	enabledFeatures.pNext		= DE_NULL;

	vki.getPhysicalDeviceFeatures2KHR(physicalDevice, &enabledFeatures);

	{
		const Unique<VkDevice>	device		(createDevice(vki, physicalDevice, &deviceCreateInfo));
		const DeviceDriver		vkd			(vki, device.get());
		const VkQueue			queue		= getDeviceQueue(vkd, *device, queueFamilyIndex, queueIndex);

		VK_CHECK(vkd.queueWaitIdle(queue));
	}

	return tcu::TestStatus::pass("Pass");
}